

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O1

void __thiscall fasttext::AutotuneStrategy::updateBest(AutotuneStrategy *this,Args *args)

{
  size_t sVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  loss_name lVar10;
  model_name mVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined3 uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined5 uVar20;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var21;
  int iVar22;
  double dVar23;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar24 [16];
  
  if ((AutotuneStrategy *)args != this) {
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this,(_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)args);
  }
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).input);
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).output);
  (this->bestArgs_).t = args->t;
  iVar22 = args->lrUpdateRate;
  iVar3 = args->dim;
  iVar4 = args->ws;
  iVar5 = args->epoch;
  iVar6 = args->minCount;
  iVar7 = args->minCountLabel;
  iVar8 = args->neg;
  iVar9 = args->wordNgrams;
  lVar10 = args->loss;
  mVar11 = args->model;
  iVar12 = args->bucket;
  iVar13 = args->minn;
  iVar14 = args->maxn;
  iVar15 = args->thread;
  (this->bestArgs_).lr = args->lr;
  (this->bestArgs_).lrUpdateRate = iVar22;
  (this->bestArgs_).dim = iVar3;
  (this->bestArgs_).ws = iVar4;
  (this->bestArgs_).epoch = iVar5;
  (this->bestArgs_).minCount = iVar6;
  (this->bestArgs_).minCountLabel = iVar7;
  (this->bestArgs_).neg = iVar8;
  (this->bestArgs_).wordNgrams = iVar9;
  (this->bestArgs_).loss = lVar10;
  (this->bestArgs_).model = mVar11;
  (this->bestArgs_).bucket = iVar12;
  (this->bestArgs_).minn = iVar13;
  (this->bestArgs_).maxn = iVar14;
  (this->bestArgs_).thread = iVar15;
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).label);
  (this->bestArgs_).verbose = args->verbose;
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).pretrainedVectors);
  uVar16 = *(undefined3 *)&args->field_0x109;
  iVar22 = args->seed;
  bVar17 = args->qout;
  bVar18 = args->retrain;
  bVar19 = args->qnorm;
  uVar20 = *(undefined5 *)&args->field_0x113;
  sVar1 = args->cutoff;
  sVar2 = args->dsub;
  (this->bestArgs_).saveOutput = args->saveOutput;
  *(undefined3 *)&(this->bestArgs_).field_0x109 = uVar16;
  (this->bestArgs_).seed = iVar22;
  (this->bestArgs_).qout = bVar17;
  (this->bestArgs_).retrain = bVar18;
  (this->bestArgs_).qnorm = bVar19;
  *(undefined5 *)&(this->bestArgs_).field_0x113 = uVar20;
  (this->bestArgs_).cutoff = sVar1;
  (this->bestArgs_).dsub = sVar2;
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).autotuneValidationFile);
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).autotuneMetric);
  iVar22 = args->autotuneDuration;
  (this->bestArgs_).autotunePredictions = args->autotunePredictions;
  (this->bestArgs_).autotuneDuration = iVar22;
  std::__cxx11::string::_M_assign((string *)&(this->bestArgs_).autotuneModelSize);
  auVar24._8_8_ = extraout_XMM1_Qb;
  auVar24._0_8_ = extraout_XMM1_Qa;
  _Var21 = std::
           __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                     ((this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  iVar22 = (int)((ulong)((long)_Var21._M_current -
                        (long)(this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  if (_Var21._M_current ==
      (this->minnChoices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar22 = 0;
  }
  this->bestMinnIndex_ = iVar22;
  auVar24 = vcvtusi2sd_avx512f(auVar24,args->dsub);
  dVar23 = log2(auVar24._0_8_);
  this->bestDsubExponent_ = (int)dVar23;
  if (args->bucket != 0) {
    this->bestNonzeroBucket_ = args->bucket;
  }
  return;
}

Assistant:

void AutotuneStrategy::updateBest(const Args& args) {
  bestArgs_ = args;
  bestMinnIndex_ = getIndex(args.minn, minnChoices_);
  bestDsubExponent_ = log2(args.dsub);
  if (args.bucket != 0) {
    bestNonzeroBucket_ = args.bucket;
  }
}